

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

void __thiscall
soul::FunctionBuilder::addBranch
          (FunctionBuilder *this,Block *target,ArgListType *targetArgs,
          pool_ptr<soul::heart::Block> *subsequentBlock)

{
  Branch *t;
  pool_ptr<soul::heart::Block> local_28;
  
  t = Module::allocate<soul::heart::Branch,soul::heart::Block&>
                ((this->super_BlockBuilder).module,target);
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::operator=
            (&t->targetArgs,targetArgs);
  local_28 = (pool_ptr<soul::heart::Block>)subsequentBlock->object;
  addTerminatorStatement(this,&t->super_Terminator,&local_28);
  return;
}

Assistant:

void addBranch (heart::Block& target, heart::Branch::ArgListType&& targetArgs, pool_ptr<heart::Block> subsequentBlock)
    {
        auto& branch = module.allocate<heart::Branch> (target);

        branch.targetArgs = std::move (targetArgs);

        addTerminatorStatement (branch, subsequentBlock);
    }